

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnTableInitExpr
          (BinaryReaderIR *this,Index segment,Index table_index)

{
  Index index;
  Location local_100;
  Var local_e0;
  Location local_98;
  Var local_78;
  unique_ptr<wabt::TableInitExpr,_std::default_delete<wabt::TableInitExpr>_> local_30;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_28;
  Index local_20;
  Index local_1c;
  Index table_index_local;
  Index segment_local;
  BinaryReaderIR *this_local;
  
  local_20 = table_index;
  local_1c = segment;
  _table_index_local = this;
  Location::Location(&local_98);
  Var::Var(&local_78,segment,&local_98);
  index = local_20;
  Location::Location(&local_100);
  Var::Var(&local_e0,index,&local_100);
  MakeUnique<wabt::TableInitExpr,wabt::Var,wabt::Var>((wabt *)&local_30,&local_78,&local_e0);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::TableInitExpr,std::default_delete<wabt::TableInitExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_28,&local_30);
  this_local._4_4_ = AppendExpr(this,&local_28);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_28);
  std::unique_ptr<wabt::TableInitExpr,_std::default_delete<wabt::TableInitExpr>_>::~unique_ptr
            (&local_30);
  Var::~Var(&local_e0);
  Var::~Var(&local_78);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnTableInitExpr(Index segment, Index table_index) {
  return AppendExpr(MakeUnique<TableInitExpr>(Var(segment), Var(table_index)));
}